

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.hpp
# Opt level: O0

void pstore::log<std::__cxx11::string>
               (priority p,czstring message,
               _Hash_node<pstore::brokerface::subscriber<pstore::descriptor_condition_variable>_*,_false>
               *d)

{
  vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>
  *this;
  bool bVar1;
  long *plVar2;
  undefined8 *puVar3;
  reference this_00;
  pointer this_01;
  double __x;
  unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_> *destination;
  iterator __end3;
  iterator __begin3;
  logger_collection *__range3;
  _Hash_node<pstore::brokerface::subscriber<pstore::descriptor_condition_variable>_*,_false>
  *d_local;
  czstring message_local;
  priority p_local;
  
  plVar2 = (long *)details::log_destinations();
  if (*plVar2 != 0) {
    puVar3 = (undefined8 *)details::log_destinations();
    this = (vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>
            *)*puVar3;
    __end3 = std::
             vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>
             ::begin(this);
    destination = (unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_> *)
                  std::
                  vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>
                  ::end(this);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_*,_std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_>
                                       *)&destination), bVar1) {
      this_00 = __gnu_cxx::
                __normal_iterator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_*,_std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_>
                ::operator*(&__end3);
      this_01 = std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>::operator->
                          (this_00);
      logger::log(this_01,__x);
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_*,_std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_>
      ::operator++(&__end3);
    }
  }
  return;
}

Assistant:

inline void log (logger::priority p, gsl::czstring message, T d) {
            if (details::log_destinations != nullptr) {
                for (std::unique_ptr<logger> & destination : *details::log_destinations) {
                    destination->log (p, message, d);
                }
            }
        }